

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O1

int mbedtls_x509_string_to_names(mbedtls_asn1_named_data **head,char *name)

{
  uchar *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  mbedtls_asn1_named_data *pmVar7;
  char *pcVar8;
  uchar *puVar9;
  uchar *puVar10;
  x509_attr_descriptor_t *pxVar11;
  uchar *puVar12;
  char data [256];
  uchar local_138 [264];
  
  sVar6 = strlen(name);
  mbedtls_asn1_free_named_data_list(head);
  if (-1 < (long)sVar6) {
    puVar10 = (uchar *)(name + sVar6);
    bVar2 = true;
    puVar12 = local_138;
    pcVar8 = (char *)0x0;
    puVar9 = (uchar *)name;
    do {
      bVar3 = true;
      if (bVar2) {
        if (*puVar9 == '=') {
          pcVar8 = "CN";
          pxVar11 = x509_attrs;
          do {
            if ((pxVar11->name_len == (long)puVar9 - (long)name) &&
               (iVar5 = strncmp(pcVar8,name,(long)puVar9 - (long)name), iVar5 == 0))
            goto LAB_0010f0b6;
            pcVar8 = pxVar11[1].name;
            pxVar11 = pxVar11 + 1;
          } while (pcVar8 != (char *)0x0);
          pxVar11 = (x509_attr_descriptor_t *)0x149b50;
LAB_0010f0b6:
          pcVar8 = pxVar11->oid;
          puVar12 = local_138;
          if (pcVar8 == (char *)0x0) {
            return -0x2100;
          }
          name = (char *)(puVar9 + 1);
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
      }
      else {
        bVar4 = true;
      }
      bVar2 = true;
      if (bVar4) {
        if (puVar9 == puVar10 || *puVar9 != '\\') {
          if (bVar4) {
            if (*puVar9 == ',' || puVar9 == puVar10) {
              sVar6 = strlen(pcVar8);
              pmVar7 = mbedtls_asn1_store_named_data
                                 (head,pcVar8,sVar6,local_138,(long)puVar12 - (long)local_138);
              name = (char *)puVar9;
              if (pmVar7 == (mbedtls_asn1_named_data *)0x0) {
                return -0x2880;
              }
              do {
                puVar9 = (uchar *)name;
                name = (char *)(puVar9 + 1);
                if (puVar10 <= puVar9) break;
              } while (*name == ' ');
            }
            else {
              bVar3 = false;
              bVar2 = false;
            }
          }
        }
        else {
          puVar9 = puVar9 + 1;
          if (puVar9 == puVar10) {
            return -0x2380;
          }
          bVar3 = false;
          bVar2 = false;
          if (*puVar9 != ',') {
            return -0x2380;
          }
        }
      }
      puVar1 = puVar9 + 1;
      if ((!bVar3) && ((uchar *)name != puVar1)) {
        *puVar12 = *puVar9;
        if ((long)puVar12 - (long)local_138 == 0xff) {
          return -0x2380;
        }
        puVar12 = puVar12 + 1;
      }
      puVar9 = puVar1;
    } while (puVar1 <= puVar10);
  }
  return 0;
}

Assistant:

int mbedtls_x509_string_to_names( mbedtls_asn1_named_data **head, const char *name )
{
    int ret = 0;
    const char *s = name, *c = s;
    const char *end = s + strlen( s );
    const char *oid = NULL;
    int in_tag = 1;
    char data[MBEDTLS_X509_MAX_DN_NAME_SIZE];
    char *d = data;

    /* Clear existing chain if present */
    mbedtls_asn1_free_named_data_list( head );

    while( c <= end )
    {
        if( in_tag && *c == '=' )
        {
            if( ( oid = x509_at_oid_from_name( s, c - s ) ) == NULL )
            {
                ret = MBEDTLS_ERR_X509_UNKNOWN_OID;
                goto exit;
            }

            s = c + 1;
            in_tag = 0;
            d = data;
        }

        if( !in_tag && *c == '\\' && c != end )
        {
            c++;

            /* Check for valid escaped characters */
            if( c == end || *c != ',' )
            {
                ret = MBEDTLS_ERR_X509_INVALID_NAME;
                goto exit;
            }
        }
        else if( !in_tag && ( *c == ',' || c == end ) )
        {
            if( mbedtls_asn1_store_named_data( head, oid, strlen( oid ),
                                       (unsigned char *) data,
                                       d - data ) == NULL )
            {
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );
            }

            while( c < end && *(c + 1) == ' ' )
                c++;

            s = c + 1;
            in_tag = 1;
        }

        if( !in_tag && s != c + 1 )
        {
            *(d++) = *c;

            if( d - data == MBEDTLS_X509_MAX_DN_NAME_SIZE )
            {
                ret = MBEDTLS_ERR_X509_INVALID_NAME;
                goto exit;
            }
        }

        c++;
    }

exit:

    return( ret );
}